

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightweight_test.hpp
# Opt level: O0

void boost::detail::test_eq_impl<bool,bool>
               (char *expr1,char *expr2,char *file,int line,char *function,bool *t,bool *u)

{
  ostream *poVar1;
  int *piVar2;
  bool *t_local;
  char *function_local;
  int line_local;
  char *file_local;
  char *expr2_local;
  char *expr1_local;
  
  if ((*t & 1U) == (*u & 1U)) {
    report_errors_remind();
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,file);
    poVar1 = std::operator<<(poVar1,"(");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,line);
    poVar1 = std::operator<<(poVar1,"): test \'");
    poVar1 = std::operator<<(poVar1,expr1);
    poVar1 = std::operator<<(poVar1," == ");
    poVar1 = std::operator<<(poVar1,expr2);
    poVar1 = std::operator<<(poVar1,"\' failed in function \'");
    poVar1 = std::operator<<(poVar1,function);
    poVar1 = std::operator<<(poVar1,"\': ");
    poVar1 = std::operator<<(poVar1,"\'");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(*t & 1));
    poVar1 = std::operator<<(poVar1,"\' != \'");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(*u & 1));
    poVar1 = std::operator<<(poVar1,"\'");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    piVar2 = test_errors();
    *piVar2 = *piVar2 + 1;
  }
  return;
}

Assistant:

inline void test_eq_impl( char const * expr1, char const * expr2,
  char const * file, int line, char const * function, T const & t, U const & u )
{
    if( t == u )
    {
        report_errors_remind();
    }
    else
    {
        BOOST_LIGHTWEIGHT_TEST_OSTREAM
            << file << "(" << line << "): test '" << expr1 << " == " << expr2
            << "' failed in function '" << function << "': "
            << "'" << t << "' != '" << u << "'" << std::endl;
        ++test_errors();
    }
}